

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_int_resizeT(ImVector_int *self,int new_size,int v)

{
  int local_4;
  
  ImVector<int>::resize(self,new_size,&local_4);
  return;
}

Assistant:

CIMGUI_API void ImVector_int_resizeT(ImVector_int* self,int new_size,const int v)
{
    return self->resize(new_size,v);
}